

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void pcmpgtq_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpcmpgtq");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      }
      ArgsVEX(pMyDisasm);
    }
    else {
      (pMyDisasm->Instruction).Category = 0x80000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      strcpy((pMyDisasm->Instruction).Mnemonic,"pcmpgtq");
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ pcmpgtq_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.VEX.state == InUsePrefix) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpcmpgtq");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
         ArgsVEX(pMyDisasm);
       } else {
         pMyDisasm->Instruction.Category = SSE41_INSTRUCTION;
         GV.MemDecoration = Arg2_m128_xmm;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pcmpgtq");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
   else {
       failDecode(pMyDisasm);
   }
}